

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild.cpp
# Opt level: O1

void __thiscall FNodeBuilder::CreateSubsectorsForReal(FNodeBuilder *this)

{
  uint *puVar1;
  FPrivSeg *pFVar2;
  uint uVar3;
  USegPtr *pUVar4;
  subsector_t *psVar5;
  seg_t *psVar6;
  seg_t *psVar7;
  ulong uVar8;
  uint uVar9;
  
  if ((this->SubsectorSets).Count != 0) {
    uVar8 = 0;
    do {
      uVar3 = (this->SegList).Count;
      psVar7 = (seg_t *)(ulong)uVar3;
      uVar9 = (this->SubsectorSets).Array[uVar8];
      while (uVar9 != 0xffffffff) {
        pFVar2 = (this->Segs).Array + uVar9;
        TArray<FNodeBuilder::USegPtr,_FNodeBuilder::USegPtr>::Grow(&this->SegList,1);
        (this->SegList).Array[(this->SegList).Count].SegPtr = pFVar2;
        puVar1 = &(this->SegList).Count;
        *puVar1 = *puVar1 + 1;
        uVar9 = pFVar2->next;
      }
      uVar9 = (this->SegList).Count - uVar3;
      qsort((this->SegList).Array + (long)psVar7,(ulong)uVar9,8,SortSegs);
      psVar6 = psVar7;
      if (uVar3 < (this->SegList).Count) {
        do {
          pUVar4 = (this->SegList).Array;
          pUVar4[(long)psVar6].SegNum =
               (int)((ulong)((long)pUVar4[(long)psVar6].SegPtr - (long)(this->Segs).Array) >> 3) *
               0x38e38e39;
          psVar6 = (seg_t *)((long)&psVar6->v1 + 1);
        } while (psVar6 < (seg_t *)(ulong)(this->SegList).Count);
      }
      TArray<subsector_t,_subsector_t>::Grow(&this->Subsectors,1);
      psVar5 = (this->Subsectors).Array;
      uVar3 = (this->Subsectors).Count;
      psVar5[uVar3].BSP = (FMiniBSP *)0x0;
      psVar5[uVar3].sector = (sector_t *)0x0;
      psVar5[uVar3].polys = (FPolyNode *)0x0;
      psVar5[uVar3].firstline = psVar7;
      psVar5[uVar3].render_sector = (sector_t *)0x0;
      psVar5[uVar3].numlines = uVar9;
      psVar5[uVar3].flags = 0;
      puVar1 = &(this->Subsectors).Count;
      *puVar1 = *puVar1 + 1;
      uVar8 = uVar8 + 1;
    } while (uVar8 < (this->SubsectorSets).Count);
  }
  return;
}

Assistant:

void FNodeBuilder::CreateSubsectorsForReal ()
{
	subsector_t sub;
	unsigned int i;

	sub.sector = NULL;
	sub.polys = NULL;
	sub.BSP = NULL;
	sub.flags = 0;
	sub.render_sector = NULL;

	for (i = 0; i < SubsectorSets.Size(); ++i)
	{
		DWORD set = SubsectorSets[i];
		DWORD firstline = (DWORD)SegList.Size();

		while (set != DWORD_MAX)
		{
			USegPtr ptr;

			ptr.SegPtr = &Segs[set];
			SegList.Push (ptr);
			set = ptr.SegPtr->next;
		}
		sub.numlines = (DWORD)(SegList.Size() - firstline);
		sub.firstline = (seg_t *)(size_t)firstline;

		// Sort segs by linedef for special effects
		qsort (&SegList[firstline], sub.numlines, sizeof(USegPtr), SortSegs);

		// Convert seg pointers into indices
		D(Printf (PRINT_LOG, "Output subsector %d:\n", Subsectors.Size()));
		for (unsigned int i = firstline; i < SegList.Size(); ++i)
		{
			D(Printf (PRINT_LOG, "  Seg %5d%c%d(%5d,%5d)-%d(%5d,%5d)  [%08x,%08x]-[%08x,%08x]\n", SegList[i].SegPtr - &Segs[0],
				SegList[i].SegPtr->linedef == -1 ? '+' : ' ',
				SegList[i].SegPtr->v1,
				Vertices[SegList[i].SegPtr->v1].x>>16,
				Vertices[SegList[i].SegPtr->v1].y>>16,
				SegList[i].SegPtr->v2,
				Vertices[SegList[i].SegPtr->v2].x>>16,
				Vertices[SegList[i].SegPtr->v2].y>>16,
				Vertices[SegList[i].SegPtr->v1].x, Vertices[SegList[i].SegPtr->v1].y,
				Vertices[SegList[i].SegPtr->v2].x, Vertices[SegList[i].SegPtr->v2].y));
			SegList[i].SegNum = DWORD(SegList[i].SegPtr - &Segs[0]);
		}
		Subsectors.Push (sub);
	}
}